

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> * __thiscall
libtorrent::bdecode_node::dict_at
          (pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
           *__return_storage_ptr__,bdecode_node *this,int i)

{
  uint uVar1;
  bdecode_token *tokens;
  int iVar2;
  int iVar3;
  string_view sVar4;
  bdecode_node local_b0;
  bdecode_node local_70;
  
  iVar2 = this->m_last_index;
  if (iVar2 == -1 || i < iVar2) {
    iVar3 = this->m_token_idx + 1;
    iVar2 = 0;
  }
  else {
    iVar3 = this->m_last_token;
  }
  tokens = this->m_root_tokens;
  for (; iVar2 < i; iVar2 = iVar2 + 1) {
    iVar3 = (*(uint *)&tokens[iVar3].field_0x4 & 0x1fffffff) + iVar3;
    iVar3 = iVar3 + (*(uint *)&tokens[iVar3].field_0x4 & 0x1fffffff);
  }
  if (0 < i) {
    this->m_last_token = iVar3;
    this->m_last_index = i;
  }
  uVar1 = *(uint *)&tokens[iVar3].field_0x4;
  bdecode_node(&local_b0,tokens,this->m_buffer,this->m_buffer_size,iVar3);
  sVar4 = string_value(&local_b0);
  bdecode_node(&local_70,tokens,this->m_buffer,this->m_buffer_size,(uVar1 & 0x1fffffff) + iVar3);
  (__return_storage_ptr__->first).ptr_ = sVar4.ptr_;
  (__return_storage_ptr__->first).len_ = sVar4.len_;
  bdecode_node(&__return_storage_ptr__->second,&local_70);
  std::
  _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   *)&local_70);
  std::
  _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, bdecode_node> bdecode_node::dict_at(int i) const
	{
		TORRENT_ASSERT(type() == dict_t);
		TORRENT_ASSERT(m_token_idx != -1);

		bdecode_token const* tokens = m_root_tokens;
		TORRENT_ASSERT(tokens[m_token_idx].type == bdecode_token::dict);

		int token = m_token_idx + 1;
		int item = 0;

		// do we have a lookup cached?
		if (m_last_index <= i && m_last_index != -1)
		{
			token = m_last_token;
			item = m_last_index;
		}

		while (item < i)
		{
			TORRENT_ASSERT(tokens[token].type == bdecode_token::string);

			// skip the key
			token += tokens[token].next_item;
			TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

			// skip the value
			token += tokens[token].next_item;

			++item;

			// index 'i' out of range
			TORRENT_ASSERT(tokens[token].type != bdecode_token::end);
		}

		// there's no point in caching the first item
		if (i > 0)
		{
			m_last_token = token;
			m_last_index = i;
		}

		int value_token = token + tokens[token].next_item;
		TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

		return std::make_pair(
			bdecode_node(tokens, m_buffer, m_buffer_size, token).string_value()
			, bdecode_node(tokens, m_buffer, m_buffer_size, value_token));
	}